

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

SmallVectorBase<slang::IntervalMapDetails::Path::Entry> * __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator=
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,
          SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *rhs)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pEVar3;
  pointer pEVar4;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  if (this == rhs) {
    return this;
  }
  uVar7 = this->len;
  uVar6 = rhs->len;
  if (uVar7 < uVar6) {
    if (this->cap < uVar6) {
      this->len = 0;
      reserve(this,rhs->len);
    }
    else if (0 < (long)uVar7) {
      pEVar3 = this->data_;
      pEVar4 = rhs->data_;
      uVar7 = uVar7 + 1;
      lVar8 = 0;
      do {
        puVar1 = (undefined8 *)((long)&pEVar4->node + lVar8);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pEVar3->node + lVar8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        uVar7 = uVar7 - 1;
        lVar8 = lVar8 + 0x10;
      } while (1 < uVar7);
    }
    uVar7 = rhs->len;
    uVar6 = this->len;
    if (uVar6 == uVar7) goto LAB_002d44c3;
    pEVar3 = rhs->data_;
    pEVar4 = this->data_;
    lVar8 = uVar6 << 4;
    do {
      puVar1 = (undefined8 *)((long)&pEVar3->node + lVar8);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pEVar4->node + lVar8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      bVar9 = uVar7 * 0x10 + -0x10 == lVar8;
      if (bVar9) break;
      lVar8 = lVar8 + 0x10;
    } while (!bVar9);
  }
  else {
    if (uVar6 == 0) {
      uVar6 = 0;
      goto LAB_002d44c3;
    }
    if ((long)uVar6 < 1) goto LAB_002d44c3;
    pEVar3 = rhs->data_;
    pEVar4 = this->data_;
    uVar6 = uVar6 + 1;
    lVar8 = 0;
    do {
      puVar1 = (undefined8 *)((long)&pEVar3->node + lVar8);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pEVar4->node + lVar8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      uVar6 = uVar6 - 1;
      lVar8 = lVar8 + 0x10;
    } while (1 < uVar6);
  }
  uVar6 = rhs->len;
LAB_002d44c3:
  this->len = uVar6;
  return this;
}

Assistant:

SmallVectorBase<T>& SmallVectorBase<T>::operator=(const SmallVectorBase<T>& rhs) {
    if (this == &rhs)
        return *this;

    // If we already have sufficient space assign the common elements,
    // then destroy any excess.
    if (len >= rhs.size()) {
        iterator newEnd;
        if (rhs.size())
            newEnd = std::ranges::copy(rhs, begin()).out;
        else
            newEnd = begin();

        std::ranges::destroy(newEnd, end());
        len = rhs.size();
        return *this;
    }

    if (capacity() < rhs.size()) {
        // If we have to grow to have enough elements, destroy the current elements.
        // This allows us to avoid copying them during the grow.
        clear();
        reserve(rhs.size());
    }
    else if (len) {
        // Otherwise, use assignment for the already-constructed elements.
        std::ranges::copy(rhs.begin(), rhs.begin() + len, begin());
    }

    // Copy construct the new elements in place.
    std::ranges::uninitialized_copy(rhs.begin() + len, rhs.end(), begin() + len,
                                    begin() + rhs.size());
    len = rhs.size();
    return *this;
}